

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::run_creation_work_item_raytracing_iteration
          (ThreadedReplayer *this,PipelineWorkItem *work_item,VkPipelineCache cache,bool primary)

{
  PFN_vkCreateRayTracingPipelinesKHR p_Var1;
  bool bVar2;
  VkResult VVar3;
  pointer pVVar4;
  VkDevice pVVar5;
  atomic<unsigned_int> *paVar6;
  duration<long,_std::ratio<1L,_1000000000L>_> local_180;
  duration<long,_std::ratio<1L,_1000000000L>_> local_178;
  uint64_t local_170;
  rep duration_ns;
  time_point end_time;
  PipelineFeedback feedback;
  time_point start_time;
  bool primary_local;
  VkPipelineCache cache_local;
  PipelineWorkItem *work_item_local;
  ThreadedReplayer *this_local;
  
  reset_work_item(this,work_item);
  feedback.stages._24_8_ = std::chrono::_V2::steady_clock::now();
  PipelineFeedback::PipelineFeedback((PipelineFeedback *)&end_time);
  if ((this->disk_pipeline_cache != (VkPipelineCache)0x0) ||
     (((this->opts).pipeline_stats & 1U) != 0)) {
    pVVar4 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ::operator->(&this->device);
    bVar2 = Fossilize::VulkanDevice::pipeline_feedback_enabled(pVVar4);
    if (bVar2) {
      PipelineFeedback::setup_pnext((PipelineFeedback *)&end_time,work_item);
    }
  }
  p_Var1 = vkCreateRayTracingPipelinesKHR;
  pVVar4 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
           operator->(&this->device);
  pVVar5 = Fossilize::VulkanDevice::get_device(pVVar4);
  VVar3 = (*p_Var1)(pVVar5,(VkDeferredOperationKHR)0x0,cache,1,
                    (VkRayTracingPipelineCreateInfoKHR *)
                    (work_item->create_info).graphics_create_info,(VkAllocationCallbacks *)0x0,
                    (work_item->output).pipeline);
  if (VVar3 == VK_SUCCESS) {
    duration_ns = std::chrono::_V2::steady_clock::now();
    local_180.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&duration_ns,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)(feedback.stages + 6));
    local_178.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_180);
    local_170 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_178);
    LOCK();
    (this->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i =
         (this->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i + local_170;
    UNLOCK();
    LOCK();
    (this->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i =
         (this->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    if (primary) {
      if (((this->opts).pipeline_stats & 1U) != 0) {
        get_pipeline_stats(this,work_item->tag,work_item->hash,*(work_item->output).pipeline,
                           (PipelineFeedback *)&end_time,local_170);
      }
      if ((this->opts).control_block != (SharedControlBlock *)0x0) {
        paVar6 = &((this->opts).control_block)->successful_raytracing;
        LOCK();
        (paVar6->super___atomic_base<unsigned_int>)._M_i =
             (paVar6->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      check_pipeline_cache_feedback(this,(PipelineFeedback *)&end_time);
    }
    complete_work_item(this,work_item);
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Failed to create raytracing pipeline for hash 0x%016lx.\n",
            work_item->hash);
    fflush(_stderr);
  }
  return;
}

Assistant:

void run_creation_work_item_raytracing_iteration(const PipelineWorkItem &work_item, VkPipelineCache cache, bool primary)
	{
		reset_work_item(work_item);

		auto start_time = chrono::steady_clock::now();

#ifdef SIMULATE_UNSTABLE_DRIVER
		spurious_crash();
#endif
		PipelineFeedback feedback;
		if ((disk_pipeline_cache || opts.pipeline_stats) && device->pipeline_feedback_enabled())
			feedback.setup_pnext(work_item);

		if (vkCreateRayTracingPipelinesKHR(device->get_device(), VK_NULL_HANDLE, cache, 1,
		                                   work_item.create_info.raytracing_create_info,
		                                   nullptr, work_item.output.pipeline) == VK_SUCCESS)
		{
			auto end_time = chrono::steady_clock::now();
			auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();

			raytracing_pipeline_ns.fetch_add(duration_ns, std::memory_order_relaxed);
			raytracing_pipeline_count.fetch_add(1, std::memory_order_relaxed);

			if (primary)
			{
				if (opts.pipeline_stats)
					get_pipeline_stats(work_item.tag, work_item.hash, *work_item.output.pipeline, feedback, duration_ns);
				if (opts.control_block)
					opts.control_block->successful_raytracing.fetch_add(1, std::memory_order_relaxed);
				check_pipeline_cache_feedback(feedback);
			}

			complete_work_item(work_item);
		}
		else
		{
			LOGE("Failed to create raytracing pipeline for hash 0x%016" PRIx64 ".\n", work_item.hash);
		}
	}